

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O2

bool __thiscall miniros::ServiceManager::unadvertiseService(ServiceManager *this,string *serv_name)

{
  __type_conflict _Var1;
  const_iterator __position;
  bool bVar2;
  allocator<char> local_69;
  ServicePublicationPtr pub;
  string local_50;
  
  std::recursive_mutex::lock(&this->shutting_down_mutex_);
  if (this->shutting_down_ == false) {
    pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::mutex::lock(&this->service_publications_mutex_);
    __position._M_node = (_List_node_base *)this;
    do {
      __position._M_node =
           (((ServiceManager *)__position._M_node)->service_publications_).
           super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      if ((ServiceManager *)__position._M_node == this) goto LAB_00246ed5;
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (__position._M_node[1]._M_next + 1),serv_name);
    } while ((!_Var1) || (((element_type *)__position._M_node[1]._M_next)->dropped_ != false));
    std::__shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2> *)
               (__position._M_node + 1));
    std::__cxx11::
    list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ::erase(&this->service_publications_,__position);
LAB_00246ed5:
    pthread_mutex_unlock((pthread_mutex_t *)&this->service_publications_mutex_);
    bVar2 = pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0;
    if (bVar2) {
      unregisterService(this,&(pub.
                               super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->name_);
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (unadvertiseService::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"miniros.service_manager",&local_69);
        console::initializeLogLocation(&unadvertiseService::loc,&local_50,Debug);
        std::__cxx11::string::~string((string *)&local_50);
      }
      if (unadvertiseService::loc.level_ != Debug) {
        console::setLogLocationLevel(&unadvertiseService::loc,Debug);
        console::checkLogLocationEnabled(&unadvertiseService::loc);
      }
      if (unadvertiseService::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,unadvertiseService::loc.logger_,
                       unadvertiseService::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                       ,0xb3,"bool miniros::ServiceManager::unadvertiseService(const string &)",
                       "shutting down service [%s]",
                       ((pub.
                         super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->name_)._M_dataplus._M_p);
      }
      ServicePublication::drop
                (pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    bVar2 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->shutting_down_mutex_);
  return bVar2;
}

Assistant:

bool ServiceManager::unadvertiseService(const string &serv_name)
{
  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_)
  {
    return false;
  }

  ServicePublicationPtr pub;
  {
    std::scoped_lock<std::mutex> lock(service_publications_mutex_);

    for (auto i = service_publications_.begin(); i != service_publications_.end(); ++i)
    {
      if((*i)->getName() == serv_name && !(*i)->isDropped())
      {
        pub = *i;
        service_publications_.erase(i);
        break;
      }
    }
  }

  if (pub)
  {
    unregisterService(pub->getName());
    MINIROS_DEBUG( "shutting down service [%s]", pub->getName().c_str());
    pub->drop();
    return true;
  }

  return false;
}